

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbwindow.cpp
# Opt level: O3

void __thiscall QXcbWindow::hide(QXcbWindow *this)

{
  QPlatformWindow *pQVar1;
  xcb_connection_t *pxVar2;
  double dVar3;
  ulong uVar4;
  int *piVar5;
  char cVar6;
  long lVar7;
  QPlatformWindow *pQVar8;
  long *plVar9;
  QPoint *pQVar10;
  QScreen *pQVar11;
  QPoint QVar12;
  QPoint *pQVar13;
  undefined8 uVar14;
  QXcbConnection *this_00;
  long lVar15;
  long lVar16;
  long in_FS_OFFSET;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  QPointF local_d0;
  QPointF local_c0;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined1 *local_a0;
  QPoint local_90;
  QPoint local_88;
  undefined8 local_80;
  uint5 uStack_78;
  undefined3 uStack_73;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  long local_60;
  
  local_60 = *(long *)(in_FS_OFFSET + 0x28);
  xcb_unmap_window((((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).
                   m_xcbConnection);
  _uStack_78 = 0;
  local_70 = 0xaaaaaaaa;
  uStack_6c = 0xaaaaaaaa;
  uStack_68 = 0xaaaaaaaa;
  uStack_64 = 0xaaaaaaaa;
  local_80 = 0x12;
  pQVar1 = &this->super_QPlatformWindow;
  lVar7 = (**(code **)(*(long *)&this->super_QPlatformWindow + 0x18))(pQVar1);
  local_80 = CONCAT44(**(undefined4 **)(*(long *)(lVar7 + 0x20) + 8),(undefined4)local_80);
  uStack_78 = (uint5)this->m_window;
  pxVar2 = (((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).m_xcbConnection;
  lVar7 = (**(code **)(*(long *)&this->super_QPlatformWindow + 0x18))(pQVar1);
  xcb_send_event(pxVar2,0,**(undefined4 **)(*(long *)(lVar7 + 0x20) + 8),0x180000,&local_80);
  xcb_flush((((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).m_xcbConnection);
  this_00 = (this->super_QXcbObject).m_connection;
  if (this_00->m_mouseGrabber == this) {
    QXcbConnection::setMouseGrabber((QXcbConnection *)this_00,(QXcbWindow *)0x0);
    this_00 = (this->super_QXcbObject).m_connection;
  }
  if (this_00->m_mousePressWindow != (QXcbWindow *)0x0) {
    pQVar8 = &this_00->m_mousePressWindow->super_QPlatformWindow;
    do {
      if (pQVar8 == pQVar1) {
        QXcbConnection::setMousePressWindow
                  ((QXcbConnection *)(this->super_QXcbObject).m_connection,(QXcbWindow *)0x0);
        break;
      }
      pQVar8 = (QPlatformWindow *)QPlatformWindow::parent();
    } while (pQVar8 != (QPlatformWindow *)0x0);
  }
  this->m_mapped = false;
  QPlatformWindow::window();
  cVar6 = QWindow::isModal();
  if (cVar6 != '\0') {
    plVar9 = (long *)(**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
    plVar9 = (long *)(**(code **)(*plVar9 + 0xb0))(plVar9);
    local_88 = (QPoint)(**(code **)(*plVar9 + 0x80))(plVar9);
    pQVar10 = (QPoint *)(**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
    QPlatformScreen::screenForPosition(pQVar10);
    pQVar11 = (QScreen *)QPlatformScreen::screen();
    local_90 = QHighDpi::fromNativePixels<QPoint,QScreen>(&local_88,pQVar11);
    local_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b0 = 0xaaaaaaaa;
    uStack_ac = 0xaaaaaaaa;
    uStack_a8 = 0xaaaaaaaa;
    uStack_a4 = 0xaaaaaaaa;
    plVar9 = (long *)(**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
    (**(code **)(*plVar9 + 0x88))(&local_b0,plVar9);
    if (local_a0 != (undefined1 *)0x0) {
      lVar7 = CONCAT44(uStack_a4,uStack_a8);
      lVar16 = (long)local_a0 << 3;
      lVar15 = 0;
      do {
        plVar9 = *(long **)(lVar7 + lVar15);
        local_c0 = (QPointF)(**(code **)(*plVar9 + 0x20))(plVar9);
        cVar6 = QRect::contains((QPoint *)&local_c0,SUB81(&local_90,0));
        if (cVar6 != '\0') {
          pQVar11 = (QScreen *)QPlatformScreen::screen();
          QVar12 = QHighDpi::toNativePixels<QPoint,QScreen>(&local_90,pQVar11);
          local_c0.xp = (qreal)QVar12;
          pQVar10 = (QPoint *)(**(code **)(*plVar9 + 0x80))(plVar9);
          if ((pQVar10 != (QPoint *)0x0) &&
             (pQVar13 = (QPoint *)QPlatformWindow::window(), pQVar10 != pQVar13)) {
            pQVar13 = (QPoint *)childWindowAt((QWindow *)pQVar10,&local_90);
            if (pQVar13 != (QPoint *)0x0) {
              pQVar10 = pQVar13;
            }
            uVar14 = QWindow::mapFromGlobal(pQVar10);
            dVar17 = (double)QHighDpiScaling::scaleAndOrigin((QWindow *)pQVar10,(Point)ZEXT812(0));
            dVar3 = dVar17 * (double)(int)uVar14;
            dVar17 = dVar17 * (double)(int)((ulong)uVar14 >> 0x20);
            auVar18._0_8_ = (double)((ulong)dVar3 & 0x8000000000000000 | 0x3fe0000000000000) + dVar3
            ;
            auVar18._8_8_ =
                 (double)((ulong)dVar17 & 0x8000000000000000 | 0x3fe0000000000000) + dVar17;
            auVar19 = maxpd(auVar18,_DAT_00190d40);
            uVar4 = -(ulong)(2147483647.0 < auVar18._8_8_) & 0x41dfffffffc00000;
            auVar20._0_8_ = ~-(ulong)(2147483647.0 < auVar18._0_8_) & auVar19._0_8_;
            auVar20._8_8_ = ~-(ulong)(2147483647.0 < auVar18._8_8_) & auVar19._8_8_;
            auVar19._8_4_ = (int)uVar4;
            auVar19._0_8_ = -(ulong)(2147483647.0 < auVar18._0_8_) & 0x41dfffffffc00000;
            auVar19._12_4_ = (int)(uVar4 >> 0x20);
            dVar3 = (double)(int)SUB168(auVar20 | auVar19,8);
            local_d0.xp = (qreal)local_88.xp.m_i.m_i;
            local_d0.yp = (qreal)local_88.yp.m_i.m_i;
            local_c0.yp._0_4_ = SUB84(dVar3,0);
            local_c0.xp = (double)(int)SUB168(auVar20 | auVar19,0);
            local_c0.yp._4_4_ = (int)((ulong)dVar3 >> 0x20);
            QWindowSystemInterface::handleEnterEvent<QWindowSystemInterface::DefaultDelivery>
                      ((QWindow *)pQVar10,&local_c0,&local_d0);
          }
          break;
        }
        lVar15 = lVar15 + 8;
      } while (lVar16 != lVar15);
    }
    piVar5 = (int *)CONCAT44(uStack_ac,local_b0);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_ac,local_b0),8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_60) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXcbWindow::hide()
{
    xcb_unmap_window(xcb_connection(), m_window);

    // send synthetic UnmapNotify event according to icccm 4.1.4
    q_padded_xcb_event<xcb_unmap_notify_event_t> event = {};
    event.response_type = XCB_UNMAP_NOTIFY;
    event.event = xcbScreen()->root();
    event.window = m_window;
    event.from_configure = false;
    xcb_send_event(xcb_connection(), false, xcbScreen()->root(),
                   XCB_EVENT_MASK_SUBSTRUCTURE_NOTIFY | XCB_EVENT_MASK_SUBSTRUCTURE_REDIRECT, (const char *)&event);

    xcb_flush(xcb_connection());

    if (connection()->mouseGrabber() == this)
        connection()->setMouseGrabber(nullptr);
    if (QPlatformWindow *w = connection()->mousePressWindow()) {
        // Unset mousePressWindow when it (or one of its parents) is unmapped
        while (w) {
            if (w == this) {
                connection()->setMousePressWindow(nullptr);
                break;
            }
            w = w->parent();
        }
    }

    m_mapped = false;

    // Hiding a modal window doesn't send an enter event to its transient parent when the
    // mouse is already over the parent window, so the enter event must be emulated.
    if (window()->isModal()) {
        // Get the cursor position at modal window screen
        const QPoint nativePos = xcbScreen()->cursor()->pos();
        const QPoint cursorPos = QHighDpi::fromNativePixels(nativePos, xcbScreen()->screenForPosition(nativePos)->screen());

        // Find the top level window at cursor position.
        // Don't use QGuiApplication::topLevelAt(): search only the virtual siblings of this window's screen
        QWindow *enterWindow = nullptr;
        const auto screens = xcbScreen()->virtualSiblings();
        for (QPlatformScreen *screen : screens) {
            if (screen->geometry().contains(cursorPos)) {
                const QPoint devicePosition = QHighDpi::toNativePixels(cursorPos, screen->screen());
                enterWindow = screen->topLevelAt(devicePosition);
                break;
            }
        }

        if (enterWindow && enterWindow != window()) {
            // Find the child window at cursor position, otherwise use the top level window
            if (QWindow *childWindow = childWindowAt(enterWindow, cursorPos))
                enterWindow = childWindow;
            const QPoint localPos = enterWindow->mapFromGlobal(cursorPos);
            QWindowSystemInterface::handleEnterEvent(enterWindow,
                                                     localPos * QHighDpiScaling::factor(enterWindow),
                                                     nativePos);
        }
    }
}